

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

vec<4,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar8;
  char cVar9;
  char cVar10;
  CanonicalDataSource CVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  size_type *psVar15;
  pointer pvVar16;
  size_t sVar17;
  element_type *buff;
  ulong uVar18;
  _Alloc_hider _Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  uvec4 uVar21;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar22;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  undefined1 auVar23 [12];
  undefined8 uVar24;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar11 = currentCanonicalDataSource(this);
  if (CVar11 != RenderBuffer) {
    if (CVar11 == NeedsCompute) {
      if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
      pvVar16 = (this->data->
                super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ind < (ulong)((long)(this->data->
                              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16 >> 4))
      goto LAB_002284b1;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      puVar14 = puVar13 + 2;
      if ((ulong *)*puVar13 == puVar14) {
        local_b8 = *puVar14;
        lStack_b0 = puVar13[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar14;
        local_c8 = (ulong *)*puVar13;
      }
      local_c0 = puVar13[1];
      *puVar13 = puVar14;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      cVar10 = '\x01';
      if (9 < ind) {
        sVar17 = ind;
        cVar9 = '\x04';
        do {
          cVar10 = cVar9;
          if (sVar17 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0022831c;
          }
          if (sVar17 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0022831c;
          }
          if (sVar17 < 10000) goto LAB_0022831c;
          bVar7 = 99999 < sVar17;
          sVar17 = sVar17 / 10000;
          cVar9 = cVar10 + '\x04';
        } while (bVar7);
        cVar10 = cVar10 + '\x01';
      }
LAB_0022831c:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
      uVar2 = CONCAT44(uStack_dc,local_e0) + local_c0;
      uVar18 = 0xf;
      if (local_c8 != &local_b8) {
        uVar18 = local_b8;
      }
      if (uVar18 < uVar2) {
        uVar18 = 0xf;
        if (local_e8 != local_d8) {
          uVar18 = local_d8[0];
        }
        if (uVar18 < uVar2) goto LAB_00228385;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00228385:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      local_108 = &local_f8;
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar13[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar13;
      }
      local_100 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_108);
      paVar20 = &local_68.field_2;
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_68.field_2._M_allocated_capacity = *psVar15;
        local_68.field_2._8_8_ = plVar12[3];
        local_68._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar15;
        local_68._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_68._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      exception(&local_68);
      _Var19._M_p = local_68._M_dataplus._M_p;
    }
    else {
      if (CVar11 != HostData) {
        return (vec<4,_unsigned_int,_(glm::qualifier)0>)ZEXT816(0);
      }
      pvVar16 = (this->data->
                super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ind < (ulong)((long)(this->data->
                              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16 >> 4))
      goto LAB_002284b1;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_b8 = *puVar14;
        lStack_b0 = plVar12[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar14;
        local_c8 = (ulong *)*plVar12;
      }
      local_c0 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cVar10 = '\x01';
      if (9 < ind) {
        sVar17 = ind;
        cVar9 = '\x04';
        do {
          cVar10 = cVar9;
          if (sVar17 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_002281d5;
          }
          if (sVar17 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_002281d5;
          }
          if (sVar17 < 10000) goto LAB_002281d5;
          bVar7 = 99999 < sVar17;
          sVar17 = sVar17 / 10000;
          cVar9 = cVar10 + '\x04';
        } while (bVar7);
        cVar10 = cVar10 + '\x01';
      }
LAB_002281d5:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
      uVar2 = CONCAT44(uStack_dc,local_e0) + local_c0;
      uVar18 = 0xf;
      if (local_c8 != &local_b8) {
        uVar18 = local_b8;
      }
      if (uVar18 < uVar2) {
        uVar18 = 0xf;
        if (local_e8 != local_d8) {
          uVar18 = local_d8[0];
        }
        if (uVar18 < uVar2) goto LAB_0022823e;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_0022823e:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      local_108 = &local_f8;
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar13[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar13;
      }
      local_100 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_108);
      paVar20 = &local_48.field_2;
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_48.field_2._M_allocated_capacity = *psVar15;
        local_48.field_2._8_8_ = plVar12[3];
        local_48._M_dataplus._M_p = (pointer)paVar20;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar15;
        local_48._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_48._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      exception(&local_48);
      _Var19._M_p = local_48._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var19._M_p != paVar20) {
      operator_delete(_Var19._M_p);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    pvVar16 = (this->data->
              super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
LAB_002284b1:
    uVar3 = pvVar16[ind].field_0;
    uVar5 = pvVar16[ind].field_1;
    vVar8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_unsigned_int,_(glm::qualifier)0>_5)uVar5;
    vVar8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_unsigned_int,_(glm::qualifier)0>_3)uVar3;
    uVar4 = pvVar16[ind].field_2;
    uVar6 = pvVar16[ind].field_3;
    vVar8.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_unsigned_int,_(glm::qualifier)0>_9)uVar6;
    vVar8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_unsigned_int,_(glm::qualifier)0>_7)uVar4;
    return vVar8;
  }
  buff = (this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)ind < buff->dataSize) goto LAB_002281c6;
  std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar14 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar14) {
    local_b8 = *puVar14;
    lStack_b0 = plVar12[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar14;
    local_c8 = (ulong *)*plVar12;
  }
  local_c0 = plVar12[1];
  *plVar12 = (long)puVar14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  cVar10 = '\x01';
  if (9 < ind) {
    sVar17 = ind;
    cVar9 = '\x04';
    do {
      cVar10 = cVar9;
      if (sVar17 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00228034;
      }
      if (sVar17 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00228034;
      }
      if (sVar17 < 10000) goto LAB_00228034;
      bVar7 = 99999 < sVar17;
      sVar17 = sVar17 / 10000;
      cVar9 = cVar10 + '\x04';
    } while (bVar7);
    cVar10 = cVar10 + '\x01';
  }
LAB_00228034:
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
  uVar2 = CONCAT44(uStack_dc,local_e0) + local_c0;
  uVar18 = 0xf;
  if (local_c8 != &local_b8) {
    uVar18 = local_b8;
  }
  if (uVar18 < uVar2) {
    uVar18 = 0xf;
    if (local_e8 != local_d8) {
      uVar18 = local_d8[0];
    }
    if (uVar18 < uVar2) goto LAB_0022809d;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_0022809d:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
  }
  local_108 = &local_f8;
  puVar1 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar13[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar13;
  }
  local_100 = puVar13[1];
  *puVar13 = puVar1;
  puVar13[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar15 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_88.field_2._M_allocated_capacity = *psVar15;
    local_88.field_2._8_8_ = plVar12[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar15;
    local_88._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_88._M_string_length = plVar12[1];
  *plVar12 = (long)psVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  exception(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  buff = (this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_002281c6:
  uVar21 = getAttributeBufferData<glm::vec<4,unsigned_int,(glm::qualifier)0>>(buff,ind);
  vVar22.field_0 = uVar21.field_0;
  auVar23._4_4_ = uVar21.field_1;
  register0x00000010 = uVar21.field_2;
  register0x00000014 = uVar21.field_3;
  return vVar22;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}